

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemdelegate.cpp
# Opt level: O3

void QAbstractItemDelegate::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined4 local_34;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  undefined4 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0:
    case 1:
    case 2:
    case 4:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        goto switchD_0052da2d_default;
      }
      break;
    default:
      puVar3 = (undefined8 *)*_a;
    }
    *puVar3 = 0;
    goto switchD_0052da2d_default;
  }
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == commitData && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == closeEditor && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == sizeHintChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    goto switchD_0052da2d_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0052da2d_default;
  switch(_id) {
  case 0:
    local_30 = *_a[1];
    local_20 = &local_30;
    iVar4 = 0;
    break;
  case 1:
    local_30 = *_a[1];
    local_34 = *_a[2];
    goto LAB_0052db84;
  case 2:
    local_30 = *_a[1];
    local_34 = 0;
LAB_0052db84:
    local_20 = &local_30;
    local_18 = &local_34;
    iVar4 = 1;
    break;
  case 3:
    local_20 = (undefined8 *)_a[1];
    iVar4 = 3;
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QAbstractItemDelegatePrivate::_q_commitDataAndCloseEditor
                (*(QAbstractItemDelegatePrivate **)(_o + 8),*_a[1]);
      return;
    }
    goto LAB_0052dbbe;
  default:
    goto switchD_0052da2d_default;
  }
  local_28 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar4,&local_28);
switchD_0052da2d_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0052dbbe:
  __stack_chk_fail();
}

Assistant:

void QAbstractItemDelegate::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractItemDelegate *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->commitData((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 1: _t->closeEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemDelegate::EndEditHint>>(_a[2]))); break;
        case 2: _t->closeEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 3: _t->sizeHintChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 4: _t->d_func()->_q_commitDataAndCloseEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(QWidget * )>(_a, &QAbstractItemDelegate::commitData, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(QWidget * , QAbstractItemDelegate::EndEditHint )>(_a, &QAbstractItemDelegate::closeEditor, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(const QModelIndex & )>(_a, &QAbstractItemDelegate::sizeHintChanged, 3))
            return;
    }
}